

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O0

SUNLinearSolver SUNLinSol_Band(N_Vector y,SUNMatrix A)

{
  SUNMatrix_ID SVar1;
  N_Vector_ID NVar2;
  sunindextype sVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  _generic_N_Vector_Ops *__ptr;
  sunindextype *__ptr_00;
  void *pvVar7;
  long local_70;
  sunindextype VecLength;
  sunindextype MatrixRows;
  SUNLinearSolverContent_Band content;
  SUNLinearSolver_Ops ops;
  SUNLinearSolver S;
  SUNMatrix A_local;
  N_Vector y_local;
  
  SVar1 = SUNMatGetID(A);
  if (SVar1 == SUNMATRIX_BAND) {
    sVar3 = SUNBandMatrix_Rows(A);
    sVar4 = SUNBandMatrix_Columns(A);
    if (sVar3 == sVar4) {
      sVar3 = SUNBandMatrix_Rows(A);
      NVar2 = N_VGetVectorID(y);
      if (((NVar2 != SUNDIALS_NVEC_SERIAL) &&
          (NVar2 = N_VGetVectorID(y), NVar2 != SUNDIALS_NVEC_OPENMP)) &&
         (NVar2 = N_VGetVectorID(y), NVar2 != SUNDIALS_NVEC_PTHREADS)) {
        return (SUNLinearSolver)0x0;
      }
      sVar4 = SUNBandMatrix_StoredUpperBandwidth(A);
      sVar5 = SUNBandMatrix_LowerBandwidth(A);
      sVar6 = SUNBandMatrix_UpperBandwidth(A);
      if (sVar3 + -1 < sVar5 + sVar6) {
        local_70 = sVar3 + -1;
      }
      else {
        sVar5 = SUNBandMatrix_LowerBandwidth(A);
        sVar6 = SUNBandMatrix_UpperBandwidth(A);
        local_70 = sVar5 + sVar6;
      }
      if (sVar4 < local_70) {
        y_local = (N_Vector)0x0;
      }
      else {
        sVar4 = GlobalVectorLength_BandLS(y);
        if (sVar3 == sVar4) {
          y_local = (N_Vector)malloc(0x10);
          if (y_local == (N_Vector)0x0) {
            y_local = (N_Vector)0x0;
          }
          else {
            __ptr = (_generic_N_Vector_Ops *)malloc(0x68);
            if (__ptr == (_generic_N_Vector_Ops *)0x0) {
              free(y_local);
              y_local = (N_Vector)0x0;
            }
            else {
              __ptr->nvgetvectorid = SUNLinSolGetType_Band;
              __ptr->nvspace = SUNLinSolInitialize_Band;
              __ptr->nvgetarraypointer = SUNLinSolSetup_Band;
              __ptr->nvsetarraypointer = SUNLinSolSolve_Band;
              __ptr->nvprod = SUNLinSolLastFlag_Band;
              __ptr->nvdiv = SUNLinSolSpace_Band;
              __ptr->nvabs = SUNLinSolFree_Band;
              __ptr->nvclone = (_func_N_Vector_N_Vector *)0x0;
              __ptr->nvcloneempty = (_func_N_Vector_N_Vector *)0x0;
              __ptr->nvdestroy = (_func_void_N_Vector *)0x0;
              __ptr->nvlinearsum = (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0;
              __ptr->nvconst = (_func_void_realtype_N_Vector *)0x0;
              __ptr->nvscale = (_func_void_realtype_N_Vector_N_Vector *)0x0;
              __ptr_00 = (sunindextype *)malloc(0x18);
              if (__ptr_00 == (sunindextype *)0x0) {
                free(__ptr);
                free(y_local);
                y_local = (N_Vector)0x0;
              }
              else {
                *__ptr_00 = sVar3;
                __ptr_00[2] = 0;
                __ptr_00[1] = 0;
                pvVar7 = malloc(sVar3 << 3);
                __ptr_00[1] = (sunindextype)pvVar7;
                if (__ptr_00[1] == 0) {
                  free(__ptr_00);
                  free(__ptr);
                  free(y_local);
                  y_local = (N_Vector)0x0;
                }
                else {
                  y_local->content = __ptr_00;
                  y_local->ops = __ptr;
                }
              }
            }
          }
        }
        else {
          y_local = (N_Vector)0x0;
        }
      }
    }
    else {
      y_local = (N_Vector)0x0;
    }
  }
  else {
    y_local = (N_Vector)0x0;
  }
  return (SUNLinearSolver)y_local;
}

Assistant:

SUNLinearSolver SUNLinSol_Band(N_Vector y, SUNMatrix A)
{
  SUNLinearSolver S;
  SUNLinearSolver_Ops ops;
  SUNLinearSolverContent_Band content;
  sunindextype MatrixRows, VecLength;
  
  /* Check compatibility with supplied SUNMatrix and N_Vector */
  if (SUNMatGetID(A) != SUNMATRIX_BAND)
    return(NULL);
  if (SUNBandMatrix_Rows(A) != SUNBandMatrix_Columns(A))
    return(NULL);
  MatrixRows = SUNBandMatrix_Rows(A);
  if ( (N_VGetVectorID(y) != SUNDIALS_NVEC_SERIAL) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_OPENMP) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_PTHREADS) )
    return(NULL);

  /* Check that A has appropriate storage upper bandwidth for factorization */
  if (SUNBandMatrix_StoredUpperBandwidth(A) <
      SUNMIN(MatrixRows-1, SUNBandMatrix_LowerBandwidth(A)+SUNBandMatrix_UpperBandwidth(A)))
    return(NULL);

  /* optimally this function would be replaced with a generic N_Vector routine */
  VecLength = GlobalVectorLength_BandLS(y);
  if (MatrixRows != VecLength)
    return(NULL);
  
  /* Create linear solver */
  S = NULL;
  S = (SUNLinearSolver) malloc(sizeof *S);
  if (S == NULL) return(NULL);
  
  /* Create linear solver operation structure */
  ops = NULL;
  ops = (SUNLinearSolver_Ops) malloc(sizeof(struct _generic_SUNLinearSolver_Ops));
  if (ops == NULL) { free(S); return(NULL); }

  /* Attach operations */
  ops->gettype           = SUNLinSolGetType_Band;
  ops->initialize        = SUNLinSolInitialize_Band;
  ops->setup             = SUNLinSolSetup_Band;
  ops->solve             = SUNLinSolSolve_Band;
  ops->lastflag          = SUNLinSolLastFlag_Band;
  ops->space             = SUNLinSolSpace_Band;
  ops->free              = SUNLinSolFree_Band;
  ops->setatimes         = NULL;
  ops->setpreconditioner = NULL;
  ops->setscalingvectors = NULL;
  ops->numiters          = NULL;
  ops->resnorm           = NULL;
  ops->resid             = NULL;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Band) malloc(sizeof(struct _SUNLinearSolverContent_Band));
  if (content == NULL) { free(ops); free(S); return(NULL); }

  /* Fill content */
  content->N = MatrixRows;
  content->last_flag = 0;
  content->pivots = NULL;
  content->pivots = (sunindextype *) malloc(MatrixRows * sizeof(sunindextype));
  if (content->pivots == NULL) {
    free(content); free(ops); free(S); return(NULL);
  }
  
  /* Attach content and ops */
  S->content = content;
  S->ops     = ops;

  return(S);
}